

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_decompress1X1_DCtx_wksp
                 (HUF_DTable *dctx,void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,
                 void *workSpace,size_t wkspSize,int flags)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = HUF_readDTableX1_wksp(dctx,cSrc,cSrcSize,workSpace,wkspSize,flags);
  sVar2 = sVar1;
  if (sVar1 < 0xffffffffffffff89) {
    sVar2 = 0xffffffffffffffb8;
    if (sVar1 <= cSrcSize && cSrcSize - sVar1 != 0) {
      sVar2 = HUF_decompress1X1_usingDTable_internal
                        (dst,dstSize,(void *)((long)cSrc + sVar1),cSrcSize - sVar1,dctx,flags);
      return sVar2;
    }
  }
  return sVar2;
}

Assistant:

size_t HUF_decompress1X1_DCtx_wksp(HUF_DTable* dctx, void* dst, size_t dstSize, const void* cSrc, size_t cSrcSize, void* workSpace, size_t wkspSize, int flags)
{
    const BYTE* ip = (const BYTE*) cSrc;

    size_t const hSize = HUF_readDTableX1_wksp(dctx, cSrc, cSrcSize, workSpace, wkspSize, flags);
    if (HUF_isError(hSize)) return hSize;
    if (hSize >= cSrcSize) return ERROR(srcSize_wrong);
    ip += hSize; cSrcSize -= hSize;

    return HUF_decompress1X1_usingDTable_internal(dst, dstSize, ip, cSrcSize, dctx, flags);
}